

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O3

void generate_hole(chunk *c,wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2,wchar_t feat)

{
  uint32_t uVar1;
  loc grid;
  wchar_t y;
  wchar_t x;
  
  if (c == (chunk *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                  ,0x198,"void generate_hole(struct chunk *, int, int, int, int, int)");
  }
  uVar1 = Rand_div(4);
  if (uVar1 < 4) {
    y = (y2 + y1) / 2;
    x = (x2 + x1) / 2;
    switch(uVar1) {
    case 0:
      y = y1;
      break;
    case 1:
      x = x1;
      break;
    case 2:
      y = y2;
      break;
    case 3:
      x = x2;
    }
    grid = (loc)loc(x,y);
    square_set_feat((chunk_conflict *)c,grid,feat);
    return;
  }
  return;
}

Assistant:

static void generate_hole(struct chunk *c, int y1, int x1, int y2, int x2,
						  int feat)
{
	/* Find the center */
	int y0 = (y1 + y2) / 2;
	int x0 = (x1 + x2) / 2;

	assert(c);

	/* Open random side */
	switch (randint0(4)) {
	case 0: square_set_feat(c, loc(x0, y1), feat); break;
	case 1: square_set_feat(c, loc(x1, y0), feat); break;
	case 2: square_set_feat(c, loc(x0, y2), feat); break;
	case 3: square_set_feat(c, loc(x2, y0), feat); break;
	}
}